

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

TimerHolder __thiscall
Liby::EventLoop::runAfter(EventLoop *this,Timestamp *timestamp,BasicHandler *handler)

{
  BasicHandler *lhs;
  pointer timeout;
  TimerHolder TVar1;
  Timestamp local_48;
  BasicHandler *handler_local;
  Timestamp *timestamp_local;
  EventLoop *this_local;
  
  handler_local = handler;
  timestamp_local = timestamp;
  this_local = this;
  timeout = std::unique_ptr<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_>::operator->
                      ((unique_ptr<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_> *)
                       (timestamp + 1));
  lhs = handler_local;
  Timestamp::now();
  operator+((Liby *)&stack0xffffffffffffffc8,(Timestamp *)lhs,&local_48);
  TVar1 = TimerQueue::insert((TimerQueue *)this,(Timestamp *)timeout,
                             (BasicHandler *)&stack0xffffffffffffffc8);
  TVar1.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TimerHolder)TVar1.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerHolder EventLoop::runAfter(const Timestamp &timestamp,
                                const BasicHandler &handler) {
    return tqueue_->insert(timestamp + Timestamp::now(), handler);
}